

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

BranchReloc * __thiscall
IRBuilderAsmJs::AddBranchInstr
          (IRBuilderAsmJs *this,BranchInstr *branchInstr,uint32 offset,uint32 targetOffset)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  BranchReloc *pBVar5;
  
  this_00 = Func::GetJITFunctionBody(this->m_func);
  uVar3 = JITTimeFunctionBody::GetByteCodeLength(this_00);
  if (uVar3 < targetOffset) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x29f,"(targetOffset <= m_func->GetJITFunctionBody()->GetByteCodeLength())",
                       "targetOffset <= m_func->GetJITFunctionBody()->GetByteCodeLength()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = IsLoopBodyOuterOffset(this,targetOffset);
  if (bVar2) {
    bVar2 = IsLoopBodyReturnIPInstr(this,this->m_lastInstr);
    if (!bVar2) {
      InsertLoopBodyReturnIPInstr(this,targetOffset,offset);
    }
    targetOffset = GetLoopBodyExitInstrOffset(this);
  }
  pBVar5 = CreateRelocRecord(this,branchInstr,offset,targetOffset);
  AddInstr(this,&branchInstr->super_Instr,offset);
  return pBVar5;
}

Assistant:

BranchReloc *
IRBuilderAsmJs::AddBranchInstr(IR::BranchInstr * branchInstr, uint32 offset, uint32 targetOffset)
{
    AssertOrFailFast(targetOffset <= m_func->GetJITFunctionBody()->GetByteCodeLength());
    //
    // Loop jitting would be done only till the LoopEnd
    // Any branches beyond that offset are for the return statement
    //
    if (IsLoopBodyOuterOffset(targetOffset))
    {
        // if we have loaded the loop IP sym from the ProfiledLoopEnd then don't add it here
        if (!IsLoopBodyReturnIPInstr(m_lastInstr))
        {
            this->InsertLoopBodyReturnIPInstr(targetOffset, offset);
        }

        // Jump the restore StSlot and Ret instruction
        targetOffset = GetLoopBodyExitInstrOffset();
    }
    BranchReloc *  reloc = nullptr;
    reloc = CreateRelocRecord(branchInstr, offset, targetOffset);

    AddInstr(branchInstr, offset);
    return reloc;
}